

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O3

bool __thiscall
CCheckQueue<FrozenCleanupCheck>::Loop(CCheckQueue<FrozenCleanupCheck> *this,bool fMaster)

{
  CCheckQueue<FrozenCleanupCheck> *pCVar1;
  long lVar2;
  FrozenCleanupCheck *this_00;
  FrozenCleanupCheck *pFVar3;
  FrozenCleanupCheck *pFVar4;
  FrozenCleanupCheck *pFVar5;
  uint uVar6;
  FrozenCleanupCheck *check;
  FrozenCleanupCheck *pFVar7;
  unique_lock *puVar8;
  undefined7 in_register_00000031;
  uint uVar9;
  ulong uVar10;
  CCheckQueue<FrozenCleanupCheck> CVar11;
  long in_FS_OFFSET;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  FrozenCleanupCheck *local_68;
  FrozenCleanupCheck *pFStack_60;
  undefined8 local_58;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar8 = (unique_lock *)(this + 0x28);
  if ((int)CONCAT71(in_register_00000031,fMaster) != 0) {
    puVar8 = (unique_lock *)(this + 0x58);
  }
  local_68 = (FrozenCleanupCheck *)0x0;
  pFStack_60 = (FrozenCleanupCheck *)0x0;
  local_58 = 0;
  std::vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_>::reserve
            ((vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_> *)&local_68,
             (ulong)*(uint *)(this + 0xb0));
  uVar10 = 0;
  CVar11 = (CCheckQueue<FrozenCleanupCheck>)0x1;
  pFVar5 = pFStack_60;
  do {
    pFStack_60 = pFVar5;
    local_48._M_owns = false;
    local_48._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_48);
    if ((int)uVar10 == 0) {
      *(int *)(this + 0xa4) = *(int *)(this + 0xa4) + 1;
    }
    else {
      this[0xa8] = (CCheckQueue<FrozenCleanupCheck>)((byte)this[0xa8] & (byte)CVar11);
      pCVar1 = this + 0xac;
      *(int *)pCVar1 = *(int *)pCVar1 - (int)uVar10;
      if (*(int *)pCVar1 == 0 && !fMaster) {
        std::condition_variable::notify_one();
      }
    }
    while( true ) {
      lVar2 = *(long *)(this + 0x90);
      if ((*(long *)(this + 0x88) != lVar2) || (this[0xd0] != (CCheckQueue<FrozenCleanupCheck>)0x0))
      break;
      if ((fMaster) && (*(int *)(this + 0xac) == 0)) {
        *(int *)(this + 0xa4) = *(int *)(this + 0xa4) + -1;
        CVar11 = this[0xa8];
        this[0xa8] = (CCheckQueue<FrozenCleanupCheck>)0x1;
        goto LAB_0031ce19;
      }
      *(int *)(this + 0xa0) = *(int *)(this + 0xa0) + 1;
      std::condition_variable::wait(puVar8);
      *(int *)(this + 0xa0) = *(int *)(this + 0xa0) + -1;
    }
    if (this[0xd0] != (CCheckQueue<FrozenCleanupCheck>)0x0) {
      CVar11 = (CCheckQueue<FrozenCleanupCheck>)0x0;
LAB_0031ce19:
      std::unique_lock<std::mutex>::~unique_lock(&local_48);
      std::vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_>::~vector
                ((vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_> *)&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (bool)CVar11;
    }
    uVar6 = (uint)((int)lVar2 - (int)*(long *)(this + 0x88)) /
            (*(int *)(this + 0xa4) + *(int *)(this + 0xa0) + 1U);
    uVar9 = *(uint *)(this + 0xb0);
    if (uVar6 < *(uint *)(this + 0xb0)) {
      uVar9 = uVar6;
    }
    uVar10 = (ulong)(uVar9 + (uVar9 == 0));
    std::vector<FrozenCleanupCheck,std::allocator<FrozenCleanupCheck>>::
    _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<FrozenCleanupCheck*,std::vector<FrozenCleanupCheck,std::allocator<FrozenCleanupCheck>>>>>
              ((vector<FrozenCleanupCheck,std::allocator<FrozenCleanupCheck>> *)&local_68,
               (FrozenCleanupCheck *)(lVar2 - uVar10),lVar2);
    std::vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_>::_M_erase
              ((vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_> *)(this + 0x88),
               (FrozenCleanupCheck *)(lVar2 - uVar10),*(FrozenCleanupCheck **)(this + 0x90));
    CVar11 = this[0xa8];
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    pFVar4 = pFStack_60;
    pFVar3 = local_68;
    pFVar7 = local_68;
    pFVar5 = pFStack_60;
    if (local_68 != pFStack_60) {
      do {
        if (((byte)CVar11 & 1) != 0) {
          CVar11 = (CCheckQueue<FrozenCleanupCheck>)0x1;
        }
        pFVar7 = pFVar7 + 1;
        this_00 = local_68;
      } while (pFVar7 != pFStack_60);
      for (; this_00 != pFVar4; this_00 = this_00 + 1) {
        FrozenCleanupCheck::~FrozenCleanupCheck(this_00);
        pFVar5 = pFVar3;
      }
    }
  } while( true );
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        std::condition_variable& cond = fMaster ? m_master_cv : m_worker_cv;
        std::vector<T> vChecks;
        vChecks.reserve(nBatchSize);
        unsigned int nNow = 0;
        bool fOk = true;
        do {
            {
                WAIT_LOCK(m_mutex, lock);
                // first do the clean-up of the previous loop run (allowing us to do it in the same critsect)
                if (nNow) {
                    fAllOk &= fOk;
                    nTodo -= nNow;
                    if (nTodo == 0 && !fMaster)
                        // We processed the last element; inform the master it can exit and return the result
                        m_master_cv.notify_one();
                } else {
                    // first iteration
                    nTotal++;
                }
                // logically, the do loop starts here
                while (queue.empty() && !m_request_stop) {
                    if (fMaster && nTodo == 0) {
                        nTotal--;
                        bool fRet = fAllOk;
                        // reset the status for new work later
                        fAllOk = true;
                        // return the current status
                        return fRet;
                    }
                    nIdle++;
                    cond.wait(lock); // wait
                    nIdle--;
                }
                if (m_request_stop) {
                    return false;
                }

                // Decide how many work units to process now.
                // * Do not try to do everything at once, but aim for increasingly smaller batches so
                //   all workers finish approximately simultaneously.
                // * Try to account for idle jobs which will instantly start helping.
                // * Don't do batches smaller than 1 (duh), or larger than nBatchSize.
                nNow = std::max(1U, std::min(nBatchSize, (unsigned int)queue.size() / (nTotal + nIdle + 1)));
                auto start_it = queue.end() - nNow;
                vChecks.assign(std::make_move_iterator(start_it), std::make_move_iterator(queue.end()));
                queue.erase(start_it, queue.end());
                // Check whether we need to do work at all
                fOk = fAllOk;
            }
            // execute work
            for (T& check : vChecks)
                if (fOk)
                    fOk = check();
            vChecks.clear();
        } while (true);
    }